

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O3

UBool utrie_setRange32_63(UNewTrie *trie,UChar32 start,UChar32 limit,uint32_t value,UBool overwrite)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  UBool UVar9;
  uint32_t *puVar10;
  long lVar11;
  uint32_t *puVar12;
  uint32_t *puVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  
  if (trie == (UNewTrie *)0x0) {
    return '\0';
  }
  uVar17 = (ulong)(uint)start;
  if (limit < start) {
    return '\0';
  }
  if (0x110000 < (uint)limit) {
    return '\0';
  }
  if (0x10ffff < (uint)start) {
    return '\0';
  }
  if (trie->isCompacted != '\0') {
    return '\0';
  }
  UVar9 = '\x01';
  if (start == limit) {
    return '\x01';
  }
  puVar12 = trie->data;
  uVar1 = *puVar12;
  uVar18 = start & 0x1f;
  if (uVar18 == 0) {
LAB_00311e8b:
    if ((int)uVar17 < (int)(limit & 0x1fffe0U)) {
      uVar19 = (ulong)-(uint)(uVar1 != value);
      do {
        uVar14 = uVar17 >> 5;
        iVar24 = trie->index[uVar14];
        lVar11 = (long)iVar24;
        if (lVar11 < 1) {
          if ((puVar12[(uint)-iVar24] != value) && (overwrite != '\0' || iVar24 == 0)) {
            if ((int)uVar19 < 0) {
              uVar18 = trie->dataLength;
              uVar19 = (ulong)uVar18;
              if ((trie->dataCapacity < (int)(uVar18 + 0x20)) ||
                 (trie->dataLength = uVar18 + 0x20, (int)uVar18 < 0)) goto LAB_00312169;
              trie->index[uVar14] = uVar18;
              puVar13 = puVar12 + -lVar11;
              puVar12 = puVar12 + uVar19;
              for (lVar15 = 0x20; lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar12 = *puVar13;
                puVar13 = puVar13 + 1;
                puVar12 = puVar12 + 1;
              }
              trie->index[uVar14] = -uVar18;
              puVar12 = trie->data;
              lVar11 = 0;
              do {
                puVar13 = puVar12 + uVar19 + lVar11;
                *puVar13 = value;
                puVar13[1] = value;
                puVar13[2] = value;
                puVar13[3] = value;
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0x20);
            }
            else {
              trie->index[uVar14] = -(int)uVar19;
            }
          }
        }
        else {
          lVar15 = 0;
          if (overwrite == '\0') {
            do {
              puVar13 = puVar12 + lVar11 + lVar15;
              uVar3 = puVar13[1];
              uVar4 = puVar13[2];
              uVar5 = puVar13[3];
              if (*puVar13 == uVar1) {
                puVar12[lVar11 + lVar15] = value;
              }
              if (uVar3 == uVar1) {
                puVar12[lVar11 + lVar15 + 1] = value;
              }
              if (uVar4 == uVar1) {
                puVar12[lVar11 + lVar15 + 2] = value;
              }
              if (uVar5 == uVar1) {
                puVar12[lVar11 + lVar15 + 3] = value;
              }
              lVar15 = lVar15 + 4;
            } while (lVar15 != 0x20);
          }
          else {
            do {
              puVar13 = puVar12 + lVar11 + lVar15;
              *puVar13 = value;
              puVar13[1] = value;
              puVar13[2] = value;
              puVar13[3] = value;
              lVar15 = lVar15 + 4;
            } while (lVar15 != 0x20);
          }
        }
        uVar17 = uVar17 + 0x20;
      } while ((int)uVar17 < (int)(limit & 0x1fffe0U));
    }
    uVar18 = limit & 0x1f;
    if (uVar18 == 0) {
      return '\x01';
    }
    uVar19 = uVar17 >> 5 & 0x7ffffff;
    uVar14 = (ulong)trie->index[uVar19];
    uVar17 = uVar14;
    if ((long)uVar14 < 1) {
      uVar16 = trie->dataLength;
      uVar17 = (ulong)uVar16;
      if ((trie->dataCapacity < (int)(uVar16 + 0x20)) ||
         (trie->dataLength = uVar16 + 0x20, (int)uVar16 < 0)) goto LAB_00312169;
      trie->index[uVar19] = uVar16;
      puVar13 = puVar12 + -uVar14;
      puVar12 = puVar12 + uVar17;
      for (lVar11 = 0x20; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar12 = *puVar13;
        puVar13 = puVar13 + 1;
        puVar12 = puVar12 + 1;
      }
      puVar12 = trie->data;
    }
    auVar8 = _DAT_00314c80;
    auVar7 = _DAT_00314c70;
    auVar6 = _DAT_00314c60;
    if (overwrite == '\0') {
      puVar12 = puVar12 + uVar17;
      puVar13 = puVar12 + uVar18;
      do {
        if (*puVar12 == uVar1) {
          *puVar12 = value;
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 < puVar13);
    }
    else {
      puVar13 = puVar12 + uVar17 + 1;
      if (puVar12 + uVar17 + 1 < puVar12 + uVar17 + uVar18) {
        puVar13 = puVar12 + uVar17 + uVar18;
      }
      uVar14 = (long)puVar13 + uVar17 * -4 + ~(ulong)puVar12;
      auVar22._8_4_ = (int)uVar14;
      auVar22._0_8_ = uVar14;
      auVar22._12_4_ = (int)(uVar14 >> 0x20);
      auVar23._0_8_ = uVar14 >> 2;
      auVar23._8_8_ = auVar22._8_8_ >> 2;
      uVar19 = 0;
      auVar23 = auVar23 ^ _DAT_00314c80;
      do {
        auVar27._8_4_ = (int)uVar19;
        auVar27._0_8_ = uVar19;
        auVar27._12_4_ = (int)(uVar19 >> 0x20);
        auVar28 = (auVar27 | auVar7) ^ auVar8;
        iVar24 = auVar23._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar24 && auVar23._0_4_ < auVar28._0_4_ ||
                    iVar24 < auVar28._4_4_) & 1)) {
          puVar12[uVar17 + uVar19] = value;
        }
        if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
            auVar28._12_4_ <= auVar23._12_4_) {
          puVar12[uVar17 + uVar19 + 1] = value;
        }
        auVar28 = (auVar27 | auVar6) ^ auVar8;
        iVar29 = auVar28._4_4_;
        if (iVar29 <= iVar24 && (iVar29 != iVar24 || auVar28._0_4_ <= auVar23._0_4_)) {
          puVar12[uVar17 + uVar19 + 2] = value;
          puVar12[uVar17 + uVar19 + 3] = value;
        }
        uVar19 = uVar19 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar19);
    }
  }
  else {
    uVar16 = trie->index[(uint)start >> 5];
    uVar19 = (ulong)uVar16;
    if (0 < (long)(int)uVar16) {
LAB_00311b92:
      auVar8 = _DAT_00314c80;
      auVar7 = _DAT_00314c70;
      auVar6 = _DAT_00314c60;
      uVar16 = start + 0x20U & 0x3fffe0;
      uVar17 = (ulong)uVar16;
      puVar12 = trie->data;
      if ((uint)limit < uVar16) {
        uVar16 = limit & 0x1f;
        puVar13 = puVar12 + uVar19 + uVar16;
        if (overwrite == '\0') {
          if (uVar16 <= uVar18) {
            return '\x01';
          }
          puVar12 = puVar12 + uVar19 + uVar18;
          do {
            if (*puVar12 == uVar1) {
              *puVar12 = value;
            }
            puVar12 = puVar12 + 1;
          } while (puVar12 < puVar13);
          return '\x01';
        }
        if (uVar16 <= uVar18) {
          return '\x01';
        }
        uVar17 = (ulong)(uVar18 << 2);
        puVar10 = (uint32_t *)((long)puVar12 + uVar17 + uVar19 * 4 + 4);
        if (puVar13 < puVar10) {
          puVar13 = puVar10;
        }
        lVar11 = uVar17 + uVar19 * 4;
        uVar14 = (long)puVar13 + (~(ulong)puVar12 - lVar11);
        auVar28._8_4_ = (int)uVar14;
        auVar28._0_8_ = uVar14;
        auVar28._12_4_ = (int)(uVar14 >> 0x20);
        auVar20._0_8_ = uVar14 >> 2;
        auVar20._8_8_ = auVar28._8_8_ >> 2;
        uVar14 = 0;
        auVar20 = auVar20 ^ _DAT_00314c80;
        do {
          auVar25._8_4_ = (int)uVar14;
          auVar25._0_8_ = uVar14;
          auVar25._12_4_ = (int)(uVar14 >> 0x20);
          auVar28 = (auVar25 | auVar7) ^ auVar8;
          iVar24 = auVar20._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar24 && auVar20._0_4_ < auVar28._0_4_ ||
                      iVar24 < auVar28._4_4_) & 1)) {
            *(uint32_t *)((long)puVar12 + uVar14 * 4 + lVar11) = value;
          }
          if ((auVar28._12_4_ != auVar20._12_4_ || auVar28._8_4_ <= auVar20._8_4_) &&
              auVar28._12_4_ <= auVar20._12_4_) {
            *(uint32_t *)((long)puVar12 + uVar14 * 4 + lVar11 + 4) = value;
          }
          auVar28 = (auVar25 | auVar6) ^ auVar8;
          iVar29 = auVar28._4_4_;
          if (iVar29 <= iVar24 && (iVar29 != iVar24 || auVar28._0_4_ <= auVar20._0_4_)) {
            *(uint32_t *)((long)puVar12 + uVar14 * 4 + lVar11 + 8) = value;
            *(uint32_t *)((long)puVar12 + uVar14 * 4 + lVar11 + 0xc) = value;
          }
          uVar14 = uVar14 + 4;
        } while ((((long)puVar13 + ((uVar19 * -4 + ~(ulong)puVar12) - uVar17) >> 2) + 4 &
                 0xfffffffffffffffc) != uVar14);
        return '\x01';
      }
      if (overwrite == '\0') {
        uVar14 = (ulong)(uVar18 << 2) - 4;
        do {
          if (*(uint32_t *)((long)puVar12 + uVar14 + uVar19 * 4 + 4) == uVar1) {
            *(uint32_t *)((long)puVar12 + uVar14 + uVar19 * 4 + 4) = value;
          }
          uVar14 = uVar14 + 4;
        } while (uVar14 < 0x7c);
      }
      else {
        auVar21._4_4_ = 0;
        auVar21._0_4_ = uVar18 ^ 0x1f;
        auVar21._8_4_ = uVar18 ^ 0x1f;
        auVar21._12_4_ = 0;
        lVar11 = (ulong)(uVar18 << 2) + uVar19 * 4;
        uVar19 = 0;
        auVar21 = auVar21 | _DAT_00314c80;
        do {
          auVar26._8_4_ = (int)uVar19;
          auVar26._0_8_ = uVar19;
          auVar26._12_4_ = (int)(uVar19 >> 0x20);
          auVar28 = (auVar26 | auVar7) ^ auVar8;
          iVar24 = auVar21._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar24 && auVar21._0_4_ < auVar28._0_4_ ||
                      iVar24 < auVar28._4_4_) & 1)) {
            *(uint32_t *)((long)puVar12 + uVar19 * 4 + lVar11) = value;
          }
          if ((auVar28._12_4_ != auVar21._12_4_ || auVar28._8_4_ <= auVar21._8_4_) &&
              auVar28._12_4_ <= auVar21._12_4_) {
            *(uint32_t *)((long)puVar12 + uVar19 * 4 + lVar11 + 4) = value;
          }
          auVar28 = (auVar26 | auVar6) ^ auVar8;
          iVar29 = auVar28._4_4_;
          if (iVar29 <= iVar24 && (iVar29 != iVar24 || auVar28._0_4_ <= auVar21._0_4_)) {
            *(uint32_t *)((long)puVar12 + uVar19 * 4 + lVar11 + 8) = value;
            *(uint32_t *)((long)puVar12 + uVar19 * 4 + lVar11 + 0xc) = value;
          }
          uVar19 = uVar19 + 4;
        } while ((0x23 - uVar18 & 0xfffffffc) != uVar19);
      }
      goto LAB_00311e8b;
    }
    uVar2 = trie->dataLength;
    uVar19 = (ulong)uVar2;
    if (((int)(uVar2 + 0x20) <= trie->dataCapacity) &&
       (trie->dataLength = uVar2 + 0x20, -1 < (int)uVar2)) {
      trie->index[(uint)start >> 5] = uVar2;
      puVar13 = puVar12 + -(long)(int)uVar16;
      puVar12 = puVar12 + uVar19;
      for (lVar11 = 0x20; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar12 = *puVar13;
        puVar13 = puVar13 + 1;
        puVar12 = puVar12 + 1;
      }
      goto LAB_00311b92;
    }
LAB_00312169:
    UVar9 = '\0';
  }
  return UVar9;
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_setRange32(UNewTrie *trie, UChar32 start, UChar32 limit, uint32_t value, UBool overwrite) {
    /*
     * repeat value in [start..limit[
     * mark index values for repeat-data blocks by setting bit 31 of the index values
     * fill around existing values if any, if(overwrite)
     */
    uint32_t initialValue;
    int32_t block, rest, repeatBlock;

    /* valid, uncompacted trie and valid indexes? */
    if( trie==NULL || trie->isCompacted ||
        (uint32_t)start>0x10ffff || (uint32_t)limit>0x110000 || start>limit
    ) {
        return FALSE;
    }
    if(start==limit) {
        return TRUE; /* nothing to do */
    }

    initialValue=trie->data[0];
    if(start&UTRIE_MASK) {
        UChar32 nextStart;

        /* set partial block at [start..following block boundary[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        nextStart=(start+UTRIE_DATA_BLOCK_LENGTH)&~UTRIE_MASK;
        if(nextStart<=limit) {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, UTRIE_DATA_BLOCK_LENGTH,
                            value, initialValue, overwrite);
            start=nextStart;
        } else {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, limit&UTRIE_MASK,
                            value, initialValue, overwrite);
            return TRUE;
        }
    }

    /* number of positions in the last, partial block */
    rest=limit&UTRIE_MASK;

    /* round down limit to a block boundary */
    limit&=~UTRIE_MASK;

    /* iterate over all-value blocks */
    if(value==initialValue) {
        repeatBlock=0;
    } else {
        repeatBlock=-1;
    }
    while(start<limit) {
        /* get index value */
        block=trie->index[start>>UTRIE_SHIFT];
        if(block>0) {
            /* already allocated, fill in value */
            utrie_fillBlock(trie->data+block, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, overwrite);
        } else if(trie->data[-block]!=value && (block==0 || overwrite)) {
            /* set the repeatBlock instead of the current block 0 or range block */
            if(repeatBlock>=0) {
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
            } else {
                /* create and set and fill the repeatBlock */
                repeatBlock=utrie_getDataBlock(trie, start);
                if(repeatBlock<0) {
                    return FALSE;
                }

                /* set the negative block number to indicate that it is a repeat block */
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
                utrie_fillBlock(trie->data+repeatBlock, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, TRUE);
            }
        }

        start+=UTRIE_DATA_BLOCK_LENGTH;
    }

    if(rest>0) {
        /* set partial block at [last block boundary..limit[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        utrie_fillBlock(trie->data+block, 0, rest, value, initialValue, overwrite);
    }

    return TRUE;
}